

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoInsertValue
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this,
          iterator position,value_type *value)

{
  basic_string<char,_eastl::allocator> **ppbVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  int iVar4;
  value_type *pvVar5;
  uint uVar6;
  basic_string<char,_eastl::allocator> *pbVar7;
  basic_string<char,_eastl::allocator> *pbVar8;
  generic_iterator<eastl::basic_string<char,_eastl::allocator>_*,_void> currentDest;
  iterator pbVar9;
  value_type *pvVar10;
  
  pvVar2 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
           mpEnd;
  if (pvVar2 == (this->
                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                mpCapacity) {
    pbVar9 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpBegin;
    iVar4 = (int)((ulong)((long)pvVar2 - (long)pbVar9) >> 5);
    uVar6 = 1;
    if (iVar4 != 0) {
      uVar6 = iVar4 * 2;
    }
    if (uVar6 == 0) {
      pbVar7 = (basic_string<char,_eastl::allocator> *)0x0;
      pbVar8 = pbVar7;
    }
    else {
      pbVar7 = (basic_string<char,_eastl::allocator> *)malloc((ulong)uVar6 << 5);
      pbVar8 = pbVar7;
    }
    for (; pbVar9 != position; pbVar9 = pbVar9 + 1) {
      pbVar7->mpBegin = pbVar9->mpBegin;
      pbVar9->mpBegin = (value_type *)0x0;
      pbVar7->mpEnd = pbVar9->mpEnd;
      pbVar9->mpEnd = (value_type *)0x0;
      pbVar7->mpCapacity = pbVar9->mpCapacity;
      pbVar9->mpCapacity = (value_type *)0x0;
      pbVar7 = pbVar7 + 1;
    }
    pbVar7->mpBegin = (value_type *)0x0;
    pbVar7->mpEnd = (value_type *)0x0;
    pbVar7->mpCapacity = (value_type *)0x0;
    pbVar7->mpBegin = value->mpBegin;
    value->mpBegin = (value_type *)0x0;
    pvVar3 = pbVar7->mpEnd;
    pbVar7->mpEnd = value->mpEnd;
    value->mpEnd = pvVar3;
    pvVar3 = pbVar7->mpCapacity;
    pbVar7->mpCapacity = value->mpCapacity;
    value->mpCapacity = pvVar3;
    pbVar9 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpEnd;
    pbVar7 = pbVar7 + 1;
    if (pbVar9 != position) {
      do {
        pbVar7->mpBegin = (value_type *)0x0;
        pbVar7->mpEnd = (value_type *)0x0;
        pbVar7->mpCapacity = (value_type *)0x0;
        pbVar7->mpBegin = position->mpBegin;
        position->mpBegin = (value_type *)0x0;
        pvVar3 = pbVar7->mpEnd;
        pbVar7->mpEnd = position->mpEnd;
        position->mpEnd = pvVar3;
        pvVar3 = pbVar7->mpCapacity;
        pbVar7->mpCapacity = position->mpCapacity;
        position->mpCapacity = pvVar3;
        position = position + 1;
        pbVar7 = pbVar7 + 1;
      } while (position != pbVar9);
      position = (this->
                 super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                 mpEnd;
    }
    pbVar9 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpBegin;
    if (pbVar9 < position) {
      do {
        pvVar3 = pbVar9->mpBegin;
        if ((pvVar3 != (value_type *)0x0) && (1 < (long)pbVar9->mpCapacity - (long)pvVar3)) {
          operator_delete__(pvVar3);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 < position);
      pbVar9 = (this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpBegin;
    }
    if (pbVar9 != (iterator)0x0) {
      operator_delete__(pbVar9);
    }
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpBegin
         = pbVar8;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd =
         pbVar7;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
    mpCapacity = pbVar8 + uVar6;
  }
  else {
    pvVar10 = value + (value < pvVar2 && position <= value);
    pvVar3 = pvVar2[-1].mpBegin;
    pvVar5 = pvVar2[-1].mpEnd;
    pvVar2[-1].mpBegin = (value_type *)0x0;
    pvVar2[-1].mpEnd = (value_type *)0x0;
    pvVar2->mpBegin = pvVar3;
    pvVar2->mpEnd = pvVar5;
    pvVar2->mpCapacity = pvVar2[-1].mpCapacity;
    pvVar2[-1].mpCapacity = (value_type *)0x0;
    pbVar7 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpEnd;
    while (pbVar8 = pbVar7 + -1, pbVar8 != position) {
      basic_string<char,_eastl::allocator>::assign(pbVar8,pbVar7[-2].mpBegin,pbVar7[-2].mpEnd);
      pbVar7 = pbVar8;
    }
    if (pvVar10 != position) {
      basic_string<char,_eastl::allocator>::assign(position,pvVar10->mpBegin,pvVar10->mpEnd);
    }
    ppbVar1 = &(this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpEnd;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, value_type&& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(std::forward<T>(*(mpEnd - 1)));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(std::forward<T>(value));
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }